

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array2d_kernel.h
# Opt level: O1

data_type * __thiscall
dlib::array2d<dlib::text_grid::data_type,_dlib::memory_manager_stateless_kernel_1<char>_>::element
          (array2d<dlib::text_grid::data_type,_dlib::memory_manager_stateless_kernel_1<char>_> *this
          )

{
  return this->cur;
}

Assistant:

T& element (
        ) 
        { 
            // make sure requires clause is not broken
            DLIB_ASSERT(current_element_valid() == true,
                         "\tT& array2d::element()()"
                         << "\n\tYou can only call element() when you are at a valid one."
                         << "\n\tthis:    " << this
            );

            return *cur; 
        }